

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_decorator.hpp
# Opt level: O3

void __thiscall ftxui::NodeDecorator::NodeDecorator(NodeDecorator *this,Element *child)

{
  shared_ptr<ftxui::Node> *in_RDX;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  Elements local_20;
  
  local_38 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Stack_30 = (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
               _M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  unpack<std::shared_ptr<ftxui::Node>>(&local_20,(ftxui *)&local_38,in_RDX);
  Node::Node(&this->super_Node,&local_20);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_20);
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
  }
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Node_00175680;
  return;
}

Assistant:

NodeDecorator(Element child) : Node(unpack(std::move(child))) {}